

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  bool bVar1;
  pointer this_00;
  linked_ptr<testing::internal::ExpectationBase> *this_01;
  ExpectationBase *this_02;
  ExpectationBase *prerequisite;
  _Self local_18;
  const_iterator it;
  ExpectationBase *this_local;
  
  it._M_node = (_Base_ptr)this;
  bVar1 = is_retired(this);
  if (!bVar1) {
    local_18._M_node = (_Base_ptr)ExpectationSet::begin(&this->immediate_prerequisites_);
    while( true ) {
      prerequisite = (ExpectationBase *)ExpectationSet::end(&this->immediate_prerequisites_);
      bVar1 = std::operator!=(&local_18,(_Self *)&prerequisite);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_18);
      this_01 = Expectation::expectation_base(this_00);
      this_02 = linked_ptr<testing::internal::ExpectationBase>::get(this_01);
      bVar1 = is_retired(this_02);
      if (!bVar1) {
        RetireAllPreRequisites(this_02);
        Retire(this_02);
      }
      std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    ExpectationBase* const prerequisite = it->expectation_base().get();
    if (!prerequisite->is_retired()) {
      prerequisite->RetireAllPreRequisites();
      prerequisite->Retire();
    }
  }
}